

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall Am_Value_List::~Am_Value_List(Am_Value_List *this)

{
  bool bVar1;
  Am_Value_List *this_local;
  
  if (this->data != (Am_Value_List_Data *)0x0) {
    bVar1 = Am_Wrapper::Is_Zero(&this->data->super_Am_Wrapper);
    if (bVar1) {
      Am_Error();
    }
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
  }
  this->data = (Am_Value_List_Data *)0x0;
  this->item = (Am_List_Item *)0x0;
  return;
}

Assistant:

Am_Value_List::~Am_Value_List()
{
  if (data) {
    if (data->Is_Zero())
      Am_Error();
    data->Release();
  }
  data = nullptr;
  item = nullptr;
}